

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmdline.h
# Opt level: O1

void __thiscall cmdline::parser::check(parser *this,int argc,bool ok)

{
  bool bVar1;
  ostream *poVar2;
  string local_88;
  string local_68;
  string local_48;
  
  bVar1 = true;
  if (argc != 1 || ok) {
    local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"help","");
    bVar1 = exist(this,&local_68);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
    }
  }
  if (bVar1 != false) {
    usage_abi_cxx11_(&local_88,this);
    std::operator<<((ostream *)&std::cerr,(string *)&local_88);
    std::__cxx11::string::~string((string *)&local_88);
    exit(0);
  }
  if (!ok) {
    error_abi_cxx11_(&local_88,this);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,local_88._M_dataplus._M_p,local_88._M_string_length);
    poVar2 = std::endl<char,std::char_traits<char>>(poVar2);
    usage_abi_cxx11_(&local_48,this);
    std::operator<<(poVar2,(string *)&local_48);
    std::__cxx11::string::~string((string *)&local_48);
    std::__cxx11::string::~string((string *)&local_88);
    exit(1);
  }
  return;
}

Assistant:

void check(int argc, bool ok) {
    if ((argc == 1 && !ok) || exist("help")) {
      std::cerr << usage();
      exit(0);
    }

    if (!ok) {
      std::cerr << error() << std::endl << usage();
      exit(1);
    }
  }